

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int parse_ignore(ly_ctx *ctx,char *data,char *endstr,uint *len)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *__s1;
  bool bVar4;
  int local_38;
  
  sVar3 = strlen(endstr);
  bVar4 = *data == '\0';
  if (!bVar4) {
    iVar2 = strncmp(data,endstr,sVar3 & 0xffffffff);
    __s1 = data;
    if (iVar2 != 0) {
      pcVar1 = data + 1;
      do {
        __s1 = pcVar1;
        bVar4 = *__s1 == '\0';
        if (bVar4) goto LAB_00122522;
        iVar2 = strncmp(__s1,endstr,sVar3 & 0xffffffff);
        pcVar1 = __s1 + 1;
      } while (iVar2 != 0);
    }
    if (!bVar4) {
      local_38 = (int)sVar3;
      *len = ((int)__s1 + local_38) - (int)data;
      return 0;
    }
  }
LAB_00122522:
  ly_vlog(ctx,LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"closing sequence",endstr);
  return 1;
}

Assistant:

static int
parse_ignore(struct ly_ctx *ctx, const char *data, const char *endstr, unsigned int *len)
{
    unsigned int slen;
    const char *c = data;

    slen = strlen(endstr);

    while (*c && strncmp(c, endstr, slen)) {
        c++;
    }
    if (!*c) {
        LOGVAL(ctx, LYE_XML_MISS, LY_VLOG_NONE, NULL, "closing sequence", endstr);
        return EXIT_FAILURE;
    }
    c += slen;

    *len = c - data;
    return EXIT_SUCCESS;
}